

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionRayleighSimple::ComputeInertiaStiffnessMatrix
          (ChBeamSectionRayleighSimple *this,ChMatrixNM<double,_6,_6> *Ki,ChVector<double> *mWvel,
          ChVector<double> *mWacc,ChVector<double> *mXacc)

{
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)Ki);
  if (((this->super_ChBeamSectionEulerSimple).super_ChBeamSectionEuler.
       compute_inertia_stiffness_matrix != false) &&
     ((this->super_ChBeamSectionEulerSimple).super_ChBeamSectionEuler.compute_Ri_Ki_by_num_diff ==
      true)) {
    ChBeamSectionEuler::ComputeInertiaStiffnessMatrix
              ((ChBeamSectionEuler *)this,Ki,mWvel,mWacc,mXacc);
    return;
  }
  return;
}

Assistant:

void ChBeamSectionRayleighSimple::ComputeInertiaStiffnessMatrix(ChMatrixNM<double, 6, 6>& Ki, ///< 6x6 sectional inertial-stiffness matrix values here
		const ChVector<>& mWvel,      ///< current angular velocity of section, in material frame
		const ChVector<>& mWacc,      ///< current angular acceleration of section, in material frame
		const ChVector<>& mXacc       ///< current acceleration of section, in material frame
	) {
		Ki.setZero();
		if (compute_inertia_stiffness_matrix == false) 
			return;
		if (this->compute_Ri_Ki_by_num_diff)
			return ChBeamSectionEuler::ComputeInertiaStiffnessMatrix(Ki, mWvel, mWacc, mXacc);
		// null [Ki^] (but only for the case where angular speeds and accelerations are assumed to corotate with local frames. 
	}